

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O0

Result __thiscall
wabt::WastParser::ParsePlainInstr
          (WastParser *this,unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr)

{
  Location loc_00;
  Location loc_01;
  Location loc_02;
  Location loc_03;
  Location loc_04;
  Location loc_05;
  Location loc_06;
  Location loc_07;
  Location loc_08;
  Location loc_09;
  Location loc_10;
  Location loc_11;
  Location loc_12;
  Location loc_13;
  Location loc_14;
  Location loc_15;
  Location loc_16;
  Location loc_17;
  Location loc_18;
  Location loc_19;
  Location loc_20;
  Location loc_21;
  Location loc_22;
  Location loc_23;
  Location loc_24;
  Location loc_25;
  Location loc_26;
  Location loc_27;
  Location loc_28;
  Location loc_29;
  Location loc_30;
  Token token_12;
  Token token_13;
  Token token_14;
  Token token_15;
  Token token_16;
  Token token_17;
  Token token_18;
  Token token_19;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  undefined8 uVar1;
  bool bVar2;
  TokenType TVar3;
  Result RVar4;
  Opcode OVar5;
  pointer pEVar6;
  SelectExpr *this_00;
  pointer pBVar7;
  pointer pBVar8;
  reference rhs;
  pointer pCVar9;
  pointer pRVar10;
  ConstExpr *this_01;
  TableCopyExpr *this_02;
  TableInitExpr *this_03;
  const_iterator end_00;
  SimdLaneOpExpr *this_04;
  Literal *pLVar11;
  const_iterator pcVar12;
  size_type sVar13;
  const_pointer pcVar14;
  SimdShuffleOpExpr *this_05;
  undefined8 in_R9;
  v128 val;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1a68;
  v128 value;
  uint32_t local_1880;
  Result local_187c;
  uint32_t value_1;
  Result result_2;
  char *end;
  char *s;
  string_view sv;
  Literal literal_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_17f8;
  iterator local_17d8;
  size_type local_17d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_17c8;
  undefined1 local_17b0 [8];
  Location loc_1;
  uchar local_1788 [4];
  int lane;
  uint8_t values [16];
  Token token_11;
  ulong uStack_16e8;
  Result result_1;
  uint64_t lane_idx;
  undefined8 local_16a0;
  Literal literal;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1680;
  iterator local_1660;
  size_type local_1658;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1650;
  undefined1 local_1638 [8];
  Token token_10;
  undefined1 local_15f0 [8];
  Token token_9;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 local_1590;
  undefined8 uStack_1588;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined1 local_1548 [8];
  Token token_8;
  undefined8 uStack_1500;
  undefined8 local_14f8;
  undefined8 uStack_14f0;
  undefined8 local_14e8;
  undefined8 uStack_14e0;
  undefined8 local_14d8;
  undefined8 uStack_14d0;
  undefined1 local_14a0 [8];
  Token token_7;
  undefined8 uStack_1458;
  undefined8 local_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 local_1430;
  undefined8 uStack_1428;
  undefined1 local_13f8 [8];
  Token token_6;
  undefined8 uStack_13b0;
  undefined8 local_13a8;
  undefined8 uStack_13a0;
  undefined8 local_1398;
  undefined8 uStack_1390;
  undefined8 local_1388;
  undefined8 uStack_1380;
  undefined1 local_1350 [8];
  Token token_5;
  undefined8 uStack_1308;
  undefined8 local_1300;
  undefined8 uStack_12f8;
  undefined8 local_12f0;
  undefined8 uStack_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined1 local_12a8 [8];
  Token token_4;
  undefined8 uStack_1260;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  undefined8 uStack_1240;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined1 local_1200 [8];
  Token token_3;
  Token local_1158;
  Token local_1118;
  Token local_10d8;
  char *local_1098;
  char *local_1090;
  size_type local_1088;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_1080;
  Enum local_1074;
  Token local_1070;
  char *local_1030;
  char *local_1028;
  size_type local_1020;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_1018;
  Enum local_100c;
  Token local_1008;
  char *local_fc8;
  char *local_fc0;
  size_type local_fb8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_fb0;
  Enum local_fa4;
  Token local_fa0;
  char *local_f60;
  char *local_f58;
  size_type local_f50;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_f48;
  Enum local_f3c;
  Token local_f38;
  char *local_ef8;
  char *local_ef0;
  size_type local_ee8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_ee0;
  Enum local_ed4;
  Token local_ed0;
  char *local_e90;
  char *local_e88;
  size_type local_e80;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_e78;
  Enum local_e6c;
  Token local_e68;
  Var local_e28;
  undefined1 local_de0 [8];
  Var table_index;
  undefined1 local_d90 [8];
  Var segment_index;
  Token local_ce0;
  Var local_ca0;
  Var local_c58;
  undefined1 local_c10 [8];
  Var src;
  Var dst;
  Token local_b40;
  Token local_b00;
  char *local_ac0;
  char *local_ab8;
  size_type local_ab0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_aa8;
  Enum local_a9c;
  Token local_a98;
  char *local_a58;
  char *local_a50;
  size_type local_a48;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_a40;
  Enum local_a34;
  Token local_a30;
  Token local_9f0;
  Token local_9b0;
  Enum local_96c;
  undefined1 local_968 [8];
  Token token_2;
  undefined1 local_8e0 [8];
  Token token_1;
  undefined1 local_898 [8];
  Token token;
  undefined1 local_850 [8];
  Const const_;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  Token local_7a0;
  char *local_760;
  char *pcStack_758;
  size_type local_750;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 aStack_748;
  Enum local_73c;
  char *local_738;
  char *local_730;
  size_type local_728;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_720;
  Enum local_714;
  Token local_710;
  char *local_6d0;
  char *local_6c8;
  size_type local_6c0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_6b8;
  Enum local_6ac;
  Token local_6a8;
  char *local_668;
  char *local_660;
  size_type local_658;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_650;
  Enum local_644;
  Token local_640;
  char *local_600;
  char *local_5f8;
  size_type local_5f0;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_5e8;
  Enum local_5dc;
  Token local_5d8;
  char *local_598;
  char *local_590;
  size_type local_588;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_580;
  Enum local_574;
  Token local_570;
  Var local_530;
  Enum local_4e8;
  Enum local_4e4;
  unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
  local_4e0;
  unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
  expr_3;
  Token local_470;
  Enum local_430;
  Enum local_42c;
  Var local_428;
  unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_> local_3e0;
  unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_> expr_2;
  Token local_370;
  Token local_330;
  Enum local_2ec;
  unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> local_2e8;
  unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_> expr_1;
  unique_ptr<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_> local_298;
  unique_ptr<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_> expr;
  Token local_228;
  char *local_1e8;
  char *local_1e0;
  size_type local_1d8;
  anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2 local_1d0;
  Enum local_1c4;
  Token local_1c0;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_180;
  Type local_168;
  Enum local_164;
  int local_160;
  Enum local_15c;
  undefined1 local_158 [8];
  TypeVector result;
  Token local_100;
  Token local_c0;
  Token local_80;
  undefined1 local_40 [8];
  Location loc;
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *out_expr_local;
  WastParser *this_local;
  
  loc.field_1._8_8_ = out_expr;
  GetLocation((Location *)local_40,this);
  TVar3 = Peek(this,0);
  uVar1 = loc.field_1._8_8_;
  switch(TVar3) {
  case AtomicLoad:
    Consume((Token *)local_1350,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_1350);
    memcpy((void *)((long)&token_6.field_2 + 0x10),local_1350,0x40);
    loc_23.filename.size_ = (size_type)loc.filename.data_;
    loc_23.filename.data_ = (char *)local_40;
    loc_23.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_23.field_1._8_8_ = loc.field_1.field_1.offset;
    token_16.loc.filename.size_ = uStack_13b0;
    token_16.loc.filename.data_ = (char *)token_6.field_2.literal_.text.size_;
    token_16.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_13a8;
    token_16.loc.field_1._8_8_ = uStack_13a0;
    token_16._32_8_ = local_1398;
    token_16.field_2.text_.data_ = (char *)uStack_1390;
    token_16.field_2.text_.size_ = local_1388;
    token_16.field_2.literal_.text.size_ = uStack_1380;
    RVar4 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)0>>
                      (this,loc_23,token_16,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicNotify:
    Consume((Token *)local_1200,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_1200);
    memcpy((void *)((long)&token_4.field_2 + 0x10),local_1200,0x40);
    loc_21.filename.size_ = (size_type)loc.filename.data_;
    loc_21.filename.data_ = (char *)local_40;
    loc_21.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_21.field_1._8_8_ = loc.field_1.field_1.offset;
    token_14.loc.filename.size_ = uStack_1260;
    token_14.loc.filename.data_ = (char *)token_4.field_2.literal_.text.size_;
    token_14.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_1258;
    token_14.loc.field_1._8_8_ = uStack_1250;
    token_14._32_8_ = local_1248;
    token_14.field_2.text_.data_ = (char *)uStack_1240;
    token_14.field_2.text_.size_ = local_1238;
    token_14.field_2.literal_.text.size_ = uStack_1230;
    RVar4 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)4>>
                      (this,loc_21,token_14,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicRmw:
    Consume((Token *)local_14a0,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_14a0);
    memcpy((void *)((long)&token_8.field_2 + 0x10),local_14a0,0x40);
    loc_25.filename.size_ = (size_type)loc.filename.data_;
    loc_25.filename.data_ = (char *)local_40;
    loc_25.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_25.field_1._8_8_ = loc.field_1.field_1.offset;
    token_18.loc.filename.size_ = uStack_1500;
    token_18.loc.filename.data_ = (char *)token_8.field_2.literal_.text.size_;
    token_18.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_14f8;
    token_18.loc.field_1._8_8_ = uStack_14f0;
    token_18._32_8_ = local_14e8;
    token_18.field_2.text_.data_ = (char *)uStack_14e0;
    token_18.field_2.text_.size_ = local_14d8;
    token_18.field_2.literal_.text.size_ = uStack_14d0;
    RVar4 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)1>>
                      (this,loc_25,token_18,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicRmwCmpxchg:
    Consume((Token *)local_1548,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_1548);
    memcpy((void *)((long)&token_9.field_2 + 0x10),local_1548,0x40);
    loc_26.filename.size_ = (size_type)loc.filename.data_;
    loc_26.filename.data_ = (char *)local_40;
    loc_26.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_26.field_1._8_8_ = loc.field_1.field_1.offset;
    token_19.loc.filename.size_ = uStack_15a8;
    token_19.loc.filename.data_ = (char *)token_9.field_2.literal_.text.size_;
    token_19.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_15a0;
    token_19.loc.field_1._8_8_ = uStack_1598;
    token_19._32_8_ = local_1590;
    token_19.field_2.text_.data_ = (char *)uStack_1588;
    token_19.field_2.text_.size_ = local_1580;
    token_19.field_2.literal_.text.size_ = uStack_1578;
    RVar4 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)2>>
                      (this,loc_26,token_19,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicStore:
    Consume((Token *)local_13f8,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_13f8);
    memcpy((void *)((long)&token_7.field_2 + 0x10),local_13f8,0x40);
    loc_24.filename.size_ = (size_type)loc.filename.data_;
    loc_24.filename.data_ = (char *)local_40;
    loc_24.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_24.field_1._8_8_ = loc.field_1.field_1.offset;
    token_17.loc.filename.size_ = uStack_1458;
    token_17.loc.filename.data_ = (char *)token_7.field_2.literal_.text.size_;
    token_17.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_1450;
    token_17.loc.field_1._8_8_ = uStack_1448;
    token_17._32_8_ = local_1440;
    token_17.field_2.text_.data_ = (char *)uStack_1438;
    token_17.field_2.text_.size_ = local_1430;
    token_17.field_2.literal_.text.size_ = uStack_1428;
    RVar4 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)3>>
                      (this,loc_24,token_17,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case AtomicWait:
    Consume((Token *)local_12a8,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_12a8);
    memcpy((void *)((long)&token_5.field_2 + 0x10),local_12a8,0x40);
    loc_22.filename.size_ = (size_type)loc.filename.data_;
    loc_22.filename.data_ = (char *)local_40;
    loc_22.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_22.field_1._8_8_ = loc.field_1.field_1.offset;
    token_15.loc.filename.size_ = uStack_1308;
    token_15.loc.filename.data_ = (char *)token_5.field_2.literal_.text.size_;
    token_15.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_1300;
    token_15.loc.field_1._8_8_ = uStack_12f8;
    token_15._32_8_ = local_12f0;
    token_15.field_2.text_.data_ = (char *)uStack_12e8;
    token_15.field_2.text_.size_ = local_12e0;
    token_15.field_2.literal_.text.size_ = uStack_12d8;
    RVar4 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)5>>
                      (this,loc_22,token_15,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Binary:
    Consume((Token *)local_8e0,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_8e0);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    OVar5 = Token::opcode((Token *)local_8e0);
    OpcodeExpr<(wabt::ExprType)6>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)6> *)pEVar6,OVar5,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  default:
    __assert_fail("!\"ParsePlainInstr should only be called when IsPlainInstr() is true\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                  ,0x837,"Result wabt::WastParser::ParsePlainInstr(std::unique_ptr<Expr> *)");
  case Br:
    Consume(&local_1c0,this);
    local_1e8 = (char *)local_40;
    local_1e0 = loc.filename.data_;
    local_1d8 = loc.filename.size_;
    local_1d0.offset = (size_t)loc.field_1.field_1.offset;
    loc_00.filename.size_ = (size_type)loc.filename.data_;
    loc_00.filename.data_ = (char *)local_40;
    loc_00.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_00.field_1._8_8_ = loc.field_1.field_1.offset;
    local_1c4 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)8>>
                                (this,loc_00,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_1c4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case BrIf:
    Consume(&local_228,this);
    loc_01.filename.size_ = (size_type)loc.filename.data_;
    loc_01.filename.data_ = (char *)local_40;
    loc_01.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_01.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)9>>
                      (this,loc_01,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case BrOnExn:
    Consume((Token *)&expr,this);
    MakeUnique<wabt::BrOnExnExpr,wabt::Location&>((wabt *)&local_298,(Location *)local_40);
    pBVar7 = std::unique_ptr<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_>::operator->
                       (&local_298);
    RVar4 = ParseVar(this,&pBVar7->label_var);
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_160 = 1;
    }
    else {
      pBVar7 = std::unique_ptr<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_>::
               operator->(&local_298);
      RVar4 = ParseVar(this,&pBVar7->event_var);
      bVar2 = Failed(RVar4);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_160 = 1;
      }
      else {
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                   &local_298);
        local_160 = 2;
      }
    }
    std::unique_ptr<wabt::BrOnExnExpr,_std::default_delete<wabt::BrOnExnExpr>_>::~unique_ptr
              (&local_298);
    goto joined_r0x002ad1e9;
  case BrTable:
    Consume((Token *)&expr_1,this);
    MakeUnique<wabt::BrTableExpr,wabt::Location&>((wabt *)&local_2e8,(Location *)local_40);
    pBVar8 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::operator->
                       (&local_2e8);
    local_2ec = (Enum)ParseVarList(this,&pBVar8->targets);
    bVar2 = Failed((Result)local_2ec);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_160 = 1;
    }
    else {
      pBVar8 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::
               operator->(&local_2e8);
      rhs = std::vector<wabt::Var,_std::allocator<wabt::Var>_>::back(&pBVar8->targets);
      pBVar8 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::
               operator->(&local_2e8);
      Var::operator=(&pBVar8->default_target,rhs);
      pBVar8 = std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::
               operator->(&local_2e8);
      std::vector<wabt::Var,_std::allocator<wabt::Var>_>::pop_back(&pBVar8->targets);
      std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                 &local_2e8);
      local_160 = 2;
    }
    std::unique_ptr<wabt::BrTableExpr,_std::default_delete<wabt::BrTableExpr>_>::~unique_ptr
              (&local_2e8);
    goto joined_r0x002ad1e9;
  case Call:
    Consume(&local_370,this);
    loc_02.filename.size_ = (size_type)loc.filename.data_;
    loc_02.filename.data_ = (char *)local_40;
    loc_02.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_02.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)12>>
                      (this,loc_02,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case CallIndirect:
    Consume((Token *)&expr_2,this);
    MakeUnique<wabt::CallIndirectExpr,wabt::Location&>((wabt *)&local_3e0,(Location *)local_40);
    pCVar9 = std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
             operator->(&local_3e0);
    Var::Var(&local_428,0,(Location *)local_40);
    ParseVarOpt(this,&pCVar9->table,&local_428);
    Var::~Var(&local_428);
    pCVar9 = std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
             operator->(&local_3e0);
    local_42c = (Enum)ParseTypeUseOpt(this,&pCVar9->decl);
    bVar2 = Failed((Result)local_42c);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_160 = 1;
    }
    else {
      pCVar9 = std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>
               ::operator->(&local_3e0);
      local_430 = (Enum)ParseUnboundFuncSignature(this,&(pCVar9->decl).sig);
      bVar2 = Failed((Result)local_430);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_160 = 1;
      }
      else {
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                   &local_3e0);
        local_160 = 2;
      }
    }
    std::unique_ptr<wabt::CallIndirectExpr,_std::default_delete<wabt::CallIndirectExpr>_>::
    ~unique_ptr(&local_3e0);
    goto joined_r0x002ad1e9;
  case Compare:
    pEVar6 = (pointer)operator_new(0x40);
    Consume((Token *)&token_2.field_2.literal_.text.size_,this);
    OVar5 = Token::opcode((Token *)&token_2.field_2.literal_.text.size_);
    OpcodeExpr<(wabt::ExprType)14>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)14> *)pEVar6,OVar5,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case Const:
    Const::Const((Const *)local_850);
    token.field_2.literal_.text.size_._4_4_ = ParseConst(this,(Const *)local_850,Normal);
    bVar2 = Failed((Result)token.field_2.literal_.text.size_._4_4_);
    uVar1 = loc.field_1._8_8_;
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    this_01 = (ConstExpr *)operator_new(0x88);
    ConstExpr::ConstExpr(this_01,(Const *)local_850,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,(pointer)this_01);
    break;
  case Convert:
    Consume((Token *)local_968,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_968);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    local_96c = (Enum)Token::opcode((Token *)local_968);
    OpcodeExpr<(wabt::ExprType)16>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)16> *)pEVar6,(Opcode)local_96c,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case DataDrop:
    Consume(&local_a30,this);
    ErrorUnlessOpcodeEnabled(this,&local_a30);
    local_a58 = (char *)local_40;
    local_a50 = loc.filename.data_;
    local_a48 = loc.filename.size_;
    local_a40.offset = (size_t)loc.field_1.field_1.offset;
    loc_11.filename.size_ = (size_type)loc.filename.data_;
    loc_11.filename.data_ = (char *)local_40;
    loc_11.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_11.field_1._8_8_ = loc.field_1.field_1.offset;
    local_a34 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)27>>
                                (this,loc_11,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_a34);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Drop:
    Consume(&local_100,this);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)17>::ExprMixin
              ((ExprMixin<(wabt::ExprType)17> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case ElemDrop:
    Consume(&local_ce0,this);
    ErrorUnlessOpcodeEnabled(this,&local_ce0);
    loc_13.filename.size_ = (size_type)loc.filename.data_;
    loc_13.filename.data_ = (char *)local_40;
    loc_13.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_13.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)46>>
                      (this,loc_13,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case GlobalGet:
    Consume(&local_6a8,this);
    local_6d0 = (char *)local_40;
    local_6c8 = loc.filename.data_;
    local_6c0 = loc.filename.size_;
    local_6b8.offset = (size_t)loc.field_1.field_1.offset;
    loc_07.filename.size_ = (size_type)loc.filename.data_;
    loc_07.filename.data_ = (char *)local_40;
    loc_07.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_07.field_1._8_8_ = loc.field_1.field_1.offset;
    local_6ac = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)18>>
                                (this,loc_07,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_6ac);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case GlobalSet:
    Consume(&local_710,this);
    local_738 = (char *)local_40;
    local_730 = loc.filename.data_;
    local_728 = loc.filename.size_;
    local_720.offset = (size_t)loc.field_1.field_1.offset;
    loc_08.filename.size_ = (size_type)loc.filename.data_;
    loc_08.filename.data_ = (char *)local_40;
    loc_08.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_08.field_1._8_8_ = loc.field_1.field_1.offset;
    local_714 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)19>>
                                (this,loc_08,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_714);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Load:
    local_760 = (char *)local_40;
    pcStack_758 = loc.filename.data_;
    local_750 = loc.filename.size_;
    aStack_748.offset = (size_t)loc.field_1.field_1.offset;
    Consume(&local_7a0,this);
    loc_09.filename.size_ = (size_type)pcStack_758;
    loc_09.filename.data_ = local_760;
    loc_09.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_750;
    loc_09.field_1._8_8_ = aStack_748.offset;
    token_12.loc.filename.size_ = local_7a0.loc.filename.size_;
    token_12.loc.filename.data_ = local_7a0.loc.filename.data_;
    token_12.loc.field_1.field_1.offset = local_7a0.loc.field_1.field_1.offset;
    token_12.loc.field_1._8_8_ = local_7a0.loc.field_1._8_8_;
    token_12.token_type_ = local_7a0.token_type_;
    token_12._36_4_ = local_7a0._36_4_;
    token_12.field_2.text_.data_ = local_7a0.field_2.text_.data_;
    token_12.field_2.text_.size_ = local_7a0.field_2.text_.size_;
    token_12.field_2.literal_.text.size_ = local_7a0.field_2.literal_.text.size_;
    local_73c = (Enum)ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)21>>
                                (this,loc_09,token_12,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_73c);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case LocalGet:
    Consume(&local_570,this);
    local_598 = (char *)local_40;
    local_590 = loc.filename.data_;
    local_588 = loc.filename.size_;
    local_580.offset = (size_t)loc.field_1.field_1.offset;
    loc_04.filename.size_ = (size_type)loc.filename.data_;
    loc_04.filename.data_ = (char *)local_40;
    loc_04.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_04.field_1._8_8_ = loc.field_1.field_1.offset;
    local_574 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)22>>
                                (this,loc_04,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_574);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case LocalSet:
    Consume(&local_5d8,this);
    local_600 = (char *)local_40;
    local_5f8 = loc.filename.data_;
    local_5f0 = loc.filename.size_;
    local_5e8.offset = (size_t)loc.field_1.field_1.offset;
    loc_05.filename.size_ = (size_type)loc.filename.data_;
    loc_05.filename.data_ = (char *)local_40;
    loc_05.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_05.field_1._8_8_ = loc.field_1.field_1.offset;
    local_5dc = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)23>>
                                (this,loc_05,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_5dc);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case LocalTee:
    Consume(&local_640,this);
    local_668 = (char *)local_40;
    local_660 = loc.filename.data_;
    local_658 = loc.filename.size_;
    local_650.offset = (size_t)loc.field_1.field_1.offset;
    loc_06.filename.size_ = (size_type)loc.filename.data_;
    loc_06.filename.data_ = (char *)local_40;
    loc_06.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_06.field_1._8_8_ = loc.field_1.field_1.offset;
    local_644 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)24>>
                                (this,loc_06,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_644);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemoryCopy:
    Consume(&local_9b0,this);
    ErrorUnlessOpcodeEnabled(this,&local_9b0);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)26>::ExprMixin
              ((ExprMixin<(wabt::ExprType)26> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case MemoryFill:
    Consume(&local_9f0,this);
    ErrorUnlessOpcodeEnabled(this,&local_9f0);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)28>::ExprMixin
              ((ExprMixin<(wabt::ExprType)28> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case MemoryGrow:
    Consume(&local_b40,this);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)29>::ExprMixin
              ((ExprMixin<(wabt::ExprType)29> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case MemoryInit:
    Consume(&local_a98,this);
    ErrorUnlessOpcodeEnabled(this,&local_a98);
    local_ac0 = (char *)local_40;
    local_ab8 = loc.filename.data_;
    local_ab0 = loc.filename.size_;
    local_aa8.offset = (size_t)loc.field_1.field_1.offset;
    loc_12.filename.size_ = (size_type)loc.filename.data_;
    loc_12.filename.data_ = (char *)local_40;
    loc_12.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_12.field_1._8_8_ = loc.field_1.field_1.offset;
    local_a9c = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)30>>
                                (this,loc_12,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_a9c);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case MemorySize:
    Consume(&local_b00,this);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)31>::ExprMixin
              ((ExprMixin<(wabt::ExprType)31> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case Nop:
    Consume(&local_c0,this);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)32>::ExprMixin
              ((ExprMixin<(wabt::ExprType)32> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case RefFunc:
    Consume(&local_1070,this);
    ErrorUnlessOpcodeEnabled(this,&local_1070);
    local_1098 = (char *)local_40;
    local_1090 = loc.filename.data_;
    local_1088 = loc.filename.size_;
    local_1080.offset = (size_t)loc.field_1.field_1.offset;
    loc_19.filename.size_ = (size_type)loc.filename.data_;
    loc_19.filename.data_ = (char *)local_40;
    loc_19.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_19.field_1._8_8_ = loc.field_1.field_1.offset;
    local_1074 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)34>>
                                 (this,loc_19,
                                  (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                  loc.field_1._8_8_);
    bVar2 = Failed((Result)local_1074);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case RefIsNull:
    Consume(&local_1118,this);
    ErrorUnlessOpcodeEnabled(this,&local_1118);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)33>::ExprMixin
              ((ExprMixin<(wabt::ExprType)33> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case RefNull:
    Consume(&local_10d8,this);
    ErrorUnlessOpcodeEnabled(this,&local_10d8);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)35>::ExprMixin
              ((ExprMixin<(wabt::ExprType)35> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case Rethrow:
    Consume((Token *)&token_3.field_2.literal_.text.size_,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&token_3.field_2.literal_.text.size_);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)36>::ExprMixin
              ((ExprMixin<(wabt::ExprType)36> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case ReturnCallIndirect:
    Consume((Token *)&expr_3,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)&expr_3);
    MakeUnique<wabt::ReturnCallIndirectExpr,wabt::Location&>
              ((wabt *)&local_4e0,(Location *)local_40);
    pRVar10 = std::
              unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
              ::operator->(&local_4e0);
    local_4e4 = (Enum)ParseTypeUseOpt(this,&pRVar10->decl);
    bVar2 = Failed((Result)local_4e4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_160 = 1;
    }
    else {
      pRVar10 = std::
                unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
                ::operator->(&local_4e0);
      local_4e8 = (Enum)ParseUnboundFuncSignature(this,&(pRVar10->decl).sig);
      bVar2 = Failed((Result)local_4e8);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_160 = 1;
      }
      else {
        pRVar10 = std::
                  unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>
                  ::operator->(&local_4e0);
        Var::Var(&local_530,0,(Location *)local_40);
        ParseVarOpt(this,&pRVar10->table,&local_530);
        Var::~Var(&local_530);
        std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::operator=
                  ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)loc.field_1._8_8_,
                   &local_4e0);
        local_160 = 2;
      }
    }
    std::
    unique_ptr<wabt::ReturnCallIndirectExpr,_std::default_delete<wabt::ReturnCallIndirectExpr>_>::
    ~unique_ptr(&local_4e0);
    goto joined_r0x002ad1e9;
  case ReturnCall:
    Consume(&local_470,this);
    ErrorUnlessOpcodeEnabled(this,&local_470);
    loc_03.filename.size_ = (size_type)loc.filename.data_;
    loc_03.filename.data_ = (char *)local_40;
    loc_03.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_03.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)38>>
                      (this,loc_03,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Return:
    Consume(&local_330,this);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)37>::ExprMixin
              ((ExprMixin<(wabt::ExprType)37> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case Select:
    Consume((Token *)&result.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,this);
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_158);
    bVar2 = Features::reference_types_enabled(&this->options_->features);
    if ((bVar2) && (bVar2 = MatchLpar(this,Result), bVar2)) {
      local_15c = (Enum)ParseValueTypeList(this,(TypeVector *)local_158);
      bVar2 = Failed((Result)local_15c);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_160 = 1;
      }
      else {
        local_164 = (Enum)Expect(this,Rpar);
        bVar2 = Failed((Result)local_164);
        if (!bVar2) goto LAB_002abbb6;
        Result::Result((Result *)((long)&this_local + 4),Error);
        local_160 = 1;
      }
    }
    else {
      Type::Type(&local_168,Any);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::push_back
                ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_158,&local_168);
LAB_002abbb6:
      uVar1 = loc.field_1._8_8_;
      this_00 = (SelectExpr *)operator_new(0x58);
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector
                (&local_180,(vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_158);
      SelectExpr::SelectExpr(this_00,&local_180,(Location *)local_40);
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
                ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,(pointer)this_00)
      ;
      std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_180);
      local_160 = 2;
    }
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector
              ((vector<wabt::Type,_std::allocator<wabt::Type>_> *)local_158);
    goto joined_r0x002ad1e9;
  case SimdLaneOp:
    Consume((Token *)local_1638,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_1638);
    bVar2 = PeekMatch(this,Last_Literal);
    if ((!bVar2) && (bVar2 = PeekMatch(this,Int), !bVar2)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1680,"a natural number",
                 (allocator *)((long)&literal.text.size_ + 7));
      local_1660 = &local_1680;
      local_1658 = 1;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&literal.text.size_ + 6));
      __l_00._M_len = local_1658;
      __l_00._M_array = local_1660;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_1650,__l_00,(allocator_type *)((long)&literal.text.size_ + 6));
      this_local._4_4_ = ErrorExpected(this,&local_1650,"123");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1650);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&literal.text.size_ + 6));
      local_1a68 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1660;
      do {
        local_1a68 = local_1a68 + -1;
        std::__cxx11::string::~string((string *)local_1a68);
      } while (local_1a68 != &local_1680);
      std::allocator<char>::~allocator((allocator<char> *)((long)&literal.text.size_ + 7));
      return (Result)this_local._4_4_;
    }
    Consume((Token *)&lane_idx,this);
    pLVar11 = Token::literal((Token *)&lane_idx);
    local_16a0 = *(undefined8 *)pLVar11;
    literal._0_8_ = (pLVar11->text).data_;
    literal.text.data_ = (char *)(pLVar11->text).size_;
    pcVar12 = string_view::begin((string_view *)&literal);
    end_00 = string_view::end((string_view *)&literal);
    RVar4 = ParseInt64(pcVar12,end_00,&stack0xffffffffffffe918,SignedAndUnsigned);
    bVar2 = Failed(RVar4);
    uVar1 = loc.field_1._8_8_;
    if (bVar2) {
      sVar13 = string_view::length((string_view *)&literal);
      pcVar14 = string_view::data((string_view *)&literal);
      loc_27.filename.size_ = (size_type)loc.filename.data_;
      loc_27.filename.data_ = (char *)local_40;
      loc_27.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           loc.filename.size_;
      loc_27.field_1._8_8_ = loc.field_1.field_1.offset;
      Error(this,loc_27,"invalid literal \"%.*s\"",sVar13 & 0xffffffff,pcVar14,loc.filename.size_,
            in_R9);
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    if (0xff < uStack_16e8) {
      sVar13 = string_view::length((string_view *)&literal);
      pcVar14 = string_view::data((string_view *)&literal);
      loc_28.filename.size_ = (size_type)loc.filename.data_;
      loc_28.filename.data_ = (char *)local_40;
      loc_28.field_1.field_1.offset =
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
           loc.filename.size_;
      loc_28.field_1._8_8_ = loc.field_1.field_1.offset;
      Error(this,loc_28,"lane index \"%.*s\" out-of-range [0, 32)",sVar13 & 0xffffffff,pcVar14,
            loc.filename.size_,in_R9);
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    this_04 = (SimdLaneOpExpr *)operator_new(0x48);
    OVar5 = Token::opcode((Token *)local_1638);
    SimdLaneOpExpr::SimdLaneOpExpr(this_04,OVar5,uStack_16e8,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,(pointer)this_04);
    break;
  case SimdShuffleOp:
    Consume((Token *)(values + 8),this);
    ErrorUnlessOpcodeEnabled(this,(Token *)(values + 8));
    for (loc_1.field_1._12_4_ = 0; (int)loc_1.field_1._12_4_ < 0x10;
        loc_1.field_1._12_4_ = loc_1.field_1._12_4_ + 1) {
      GetLocation((Location *)local_17b0,this);
      bVar2 = PeekMatch(this,Last_Literal);
      if (!bVar2) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_17f8,"a natural number in range [0, 32)",
                   (allocator *)((long)&literal_1.text.size_ + 7));
        local_17d8 = &local_17f8;
        local_17d0 = 1;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&literal_1.text.size_ + 6));
        __l._M_len = local_17d0;
        __l._M_array = local_17d8;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_17c8,__l,(allocator_type *)((long)&literal_1.text.size_ + 6));
        this_local._4_4_ = ErrorExpected(this,&local_17c8,(char *)0x0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_17c8);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&literal_1.text.size_ + 6));
        local_1aa0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_17d8;
        do {
          local_1aa0 = local_1aa0 + -1;
          std::__cxx11::string::~string((string *)local_1aa0);
        } while (local_1aa0 != &local_17f8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&literal_1.text.size_ + 7));
        return (Result)this_local._4_4_;
      }
      Consume((Token *)&sv.size_,this);
      pLVar11 = Token::literal((Token *)&sv.size_);
      s = (pLVar11->text).data_;
      sv.data_ = (char *)(pLVar11->text).size_;
      literal_1._0_8_ = s;
      literal_1.text.data_ = sv.data_;
      pcVar12 = string_view::begin((string_view *)&s);
      _value_1 = string_view::end((string_view *)&s);
      Result::Result(&local_187c);
      local_1880 = 0;
      local_187c = ParseInt32(pcVar12,_value_1,&local_1880,UnsignedOnly);
      bVar2 = Failed(local_187c);
      if (bVar2) {
        sVar13 = string_view::length((string_view *)&literal_1);
        pcVar14 = string_view::data((string_view *)&literal_1);
        loc_29.filename.size_ = (size_type)loc_1.filename.data_;
        loc_29.filename.data_ = (char *)local_17b0;
        loc_29.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             loc_1.filename.size_;
        loc_29.field_1._8_8_ = loc_1.field_1.field_1.offset;
        Error(this,loc_29,"invalid literal \"%.*s\"",sVar13 & 0xffffffff,pcVar14,
              loc_1.filename.size_,in_R9);
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      if (0xff < local_1880) {
        sVar13 = string_view::length((string_view *)&literal_1);
        pcVar14 = string_view::data((string_view *)&literal_1);
        loc_30.filename.size_ = (size_type)loc_1.filename.data_;
        loc_30.filename.data_ = (char *)local_17b0;
        loc_30.field_1.field_1.offset =
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
             loc_1.filename.size_;
        loc_30.field_1._8_8_ = loc_1.field_1.field_1.offset;
        Error(this,loc_30,"shuffle index \"%.*s\" out-of-range [0, 32)",sVar13 & 0xffffffff,pcVar14,
              loc_1.filename.size_,in_R9);
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      local_1788[(int)loc_1.field_1._12_4_] = (uchar)local_1880;
    }
    val = Bitcast<v128,unsigned_char(&)[16]>((uchar (*) [16])local_1788);
    uVar1 = loc.field_1._8_8_;
    this_05 = (SimdShuffleOpExpr *)operator_new(0x50);
    OVar5 = Token::opcode((Token *)(values + 8));
    SimdShuffleOpExpr::SimdShuffleOpExpr(this_05,OVar5,val,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,(pointer)this_05);
    break;
  case Store:
    Consume((Token *)(const_.nan_ + 2),this);
    loc_10.filename.size_ = (size_type)loc.filename.data_;
    loc_10.filename.data_ = (char *)local_40;
    loc_10.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_10.field_1._8_8_ = loc.field_1.field_1.offset;
    token_13.loc.filename.size_ = uStack_800;
    token_13.loc.filename.data_ = (char *)const_.nan_._8_8_;
    token_13.loc.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)local_7f8;
    token_13.loc.field_1._8_8_ = uStack_7f0;
    token_13._32_8_ = local_7e8;
    token_13.field_2.text_.data_ = (char *)uStack_7e0;
    token_13.field_2.text_.size_ = local_7d8;
    token_13.field_2.literal_.text.size_ = uStack_7d0;
    RVar4 = ParsePlainLoadStoreInstr<wabt::LoadStoreExpr<(wabt::ExprType)44>>
                      (this,loc_10,token_13,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableCopy:
    Consume((Token *)((long)&dst.field_2 + 0x18),this);
    ErrorUnlessOpcodeEnabled(this,(Token *)((long)&dst.field_2 + 0x18));
    Var::Var((Var *)((long)&src.field_2 + 0x18),0,(Location *)local_40);
    Var::Var((Var *)local_c10,0,(Location *)local_40);
    bVar2 = Features::reference_types_enabled(&this->options_->features);
    if (bVar2) {
      Var::Var(&local_c58,(Var *)((long)&src.field_2 + 0x18));
      ParseVarOpt(this,(Var *)((long)&src.field_2 + 0x18),&local_c58);
      Var::~Var(&local_c58);
      Var::Var(&local_ca0,(Var *)local_c10);
      ParseVarOpt(this,(Var *)local_c10,&local_ca0);
      Var::~Var(&local_ca0);
    }
    uVar1 = loc.field_1._8_8_;
    this_02 = (TableCopyExpr *)operator_new(0xd0);
    TableCopyExpr::TableCopyExpr
              (this_02,(Var *)((long)&src.field_2 + 0x18),(Var *)local_c10,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,(pointer)this_02);
    local_160 = 2;
    Var::~Var((Var *)local_c10);
    Var::~Var((Var *)((long)&src.field_2 + 0x18));
    break;
  case TableFill:
    Consume(&local_1008,this);
    ErrorUnlessOpcodeEnabled(this,&local_1008);
    local_1030 = (char *)local_40;
    local_1028 = loc.filename.data_;
    local_1020 = loc.filename.size_;
    local_1018.offset = (size_t)loc.field_1.field_1.offset;
    loc_18.filename.size_ = (size_type)loc.filename.data_;
    loc_18.filename.data_ = (char *)local_40;
    loc_18.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_18.field_1._8_8_ = loc.field_1.field_1.offset;
    local_100c = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)52>>
                                 (this,loc_18,
                                  (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                  loc.field_1._8_8_);
    bVar2 = Failed((Result)local_100c);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableGet:
    Consume(&local_e68,this);
    ErrorUnlessOpcodeEnabled(this,&local_e68);
    local_e90 = (char *)local_40;
    local_e88 = loc.filename.data_;
    local_e80 = loc.filename.size_;
    local_e78.offset = (size_t)loc.field_1.field_1.offset;
    loc_14.filename.size_ = (size_type)loc.filename.data_;
    loc_14.filename.data_ = (char *)local_40;
    loc_14.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_14.field_1._8_8_ = loc.field_1.field_1.offset;
    local_e6c = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)48>>
                                (this,loc_14,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_e6c);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableGrow:
    Consume(&local_f38,this);
    ErrorUnlessOpcodeEnabled(this,&local_f38);
    local_f60 = (char *)local_40;
    local_f58 = loc.filename.data_;
    local_f50 = loc.filename.size_;
    local_f48.offset = (size_t)loc.field_1.field_1.offset;
    loc_16.filename.size_ = (size_type)loc.filename.data_;
    loc_16.filename.data_ = (char *)local_40;
    loc_16.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_16.field_1._8_8_ = loc.field_1.field_1.offset;
    local_f3c = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)49>>
                                (this,loc_16,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_f3c);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableInit:
    Consume((Token *)((long)&segment_index.field_2 + 0x18),this);
    ErrorUnlessOpcodeEnabled(this,(Token *)((long)&segment_index.field_2 + 0x18));
    Var::Var((Var *)local_d90,0,(Location *)local_40);
    table_index.field_2._28_4_ = ParseVar(this,(Var *)local_d90);
    bVar2 = Failed((Result)table_index.field_2._28_4_);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      local_160 = 1;
    }
    else {
      Var::Var((Var *)local_de0,0,(Location *)local_40);
      Var::Var(&local_e28,(Var *)local_de0);
      bVar2 = ParseVarOpt(this,(Var *)local_de0,&local_e28);
      Var::~Var(&local_e28);
      if (bVar2) {
        std::swap<wabt::Var>((Var *)local_d90,(Var *)local_de0);
      }
      uVar1 = loc.field_1._8_8_;
      this_03 = (TableInitExpr *)operator_new(0xd0);
      TableInitExpr::TableInitExpr(this_03,(Var *)local_d90,(Var *)local_de0,(Location *)local_40);
      std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
                ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,(pointer)this_03)
      ;
      local_160 = 2;
      Var::~Var((Var *)local_de0);
    }
    Var::~Var((Var *)local_d90);
joined_r0x002ad1e9:
    if (local_160 == 1) {
      return (Result)this_local._4_4_;
    }
    break;
  case TableSet:
    Consume(&local_ed0,this);
    ErrorUnlessOpcodeEnabled(this,&local_ed0);
    local_ef8 = (char *)local_40;
    local_ef0 = loc.filename.data_;
    local_ee8 = loc.filename.size_;
    local_ee0.offset = (size_t)loc.field_1.field_1.offset;
    loc_15.filename.size_ = (size_type)loc.filename.data_;
    loc_15.filename.data_ = (char *)local_40;
    loc_15.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_15.field_1._8_8_ = loc.field_1.field_1.offset;
    local_ed4 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)51>>
                                (this,loc_15,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_ed4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case TableSize:
    Consume(&local_fa0,this);
    ErrorUnlessOpcodeEnabled(this,&local_fa0);
    local_fc8 = (char *)local_40;
    local_fc0 = loc.filename.data_;
    local_fb8 = loc.filename.size_;
    local_fb0.offset = (size_t)loc.field_1.field_1.offset;
    loc_17.filename.size_ = (size_type)loc.filename.data_;
    loc_17.filename.data_ = (char *)local_40;
    loc_17.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_17.field_1._8_8_ = loc.field_1.field_1.offset;
    local_fa4 = (Enum)ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)50>>
                                (this,loc_17,
                                 (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)
                                 loc.field_1._8_8_);
    bVar2 = Failed((Result)local_fa4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Ternary:
    Consume((Token *)local_15f0,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_15f0);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    token_10.field_2.literal_.text.size_._4_4_ = Token::opcode((Token *)local_15f0);
    OpcodeExpr<(wabt::ExprType)53>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)53> *)pEVar6,
               (Opcode)token_10.field_2.literal_.text.size_._4_4_,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case Throw:
    Consume(&local_1158,this);
    ErrorUnlessOpcodeEnabled(this,&local_1158);
    loc_20.filename.size_ = (size_type)loc.filename.data_;
    loc_20.filename.data_ = (char *)local_40;
    loc_20.field_1.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)loc.filename.size_;
    loc_20.field_1._8_8_ = loc.field_1.field_1.offset;
    RVar4 = ParsePlainInstrVar<wabt::VarExpr<(wabt::ExprType)54>>
                      (this,loc_20,
                       (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)loc.field_1._8_8_
                      );
    bVar2 = Failed(RVar4);
    if (bVar2) {
      Result::Result((Result *)((long)&this_local + 4),Error);
      return (Result)this_local._4_4_;
    }
    break;
  case Unary:
    Consume((Token *)local_898,this);
    ErrorUnlessOpcodeEnabled(this,(Token *)local_898);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    token_1.field_2.literal_.text.size_._4_4_ = Token::opcode((Token *)local_898);
    OpcodeExpr<(wabt::ExprType)56>::OpcodeExpr
              ((OpcodeExpr<(wabt::ExprType)56> *)pEVar6,
               (Opcode)token_1.field_2.literal_.text.size_._4_4_,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
    break;
  case Last_Opcode:
    Consume(&local_80,this);
    uVar1 = loc.field_1._8_8_;
    pEVar6 = (pointer)operator_new(0x40);
    ExprMixin<(wabt::ExprType)57>::ExprMixin
              ((ExprMixin<(wabt::ExprType)57> *)pEVar6,(Location *)local_40);
    std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::reset
              ((unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)uVar1,pEVar6);
  }
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WastParser::ParsePlainInstr(std::unique_ptr<Expr>* out_expr) {
  WABT_TRACE(ParsePlainInstr);
  Location loc = GetLocation();
  switch (Peek()) {
    case TokenType::Unreachable:
      Consume();
      out_expr->reset(new UnreachableExpr(loc));
      break;

    case TokenType::Nop:
      Consume();
      out_expr->reset(new NopExpr(loc));
      break;

    case TokenType::Drop:
      Consume();
      out_expr->reset(new DropExpr(loc));
      break;

    case TokenType::Select: {
      Consume();
      TypeVector result;
      if (options_->features.reference_types_enabled() &&
          MatchLpar(TokenType::Result)) {
        CHECK_RESULT(ParseValueTypeList(&result));
        EXPECT(Rpar);
      } else {
        result.push_back(Type::Any);
      }
      out_expr->reset(new SelectExpr(result, loc));
      break;
    }

    case TokenType::Br:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrExpr>(loc, out_expr));
      break;

    case TokenType::BrIf:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<BrIfExpr>(loc, out_expr));
      break;

    case TokenType::BrOnExn: {
      Consume();
      auto expr = MakeUnique<BrOnExnExpr>(loc);
      CHECK_RESULT(ParseVar(&expr->label_var));
      CHECK_RESULT(ParseVar(&expr->event_var));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::BrTable: {
      Consume();
      auto expr = MakeUnique<BrTableExpr>(loc);
      CHECK_RESULT(ParseVarList(&expr->targets));
      expr->default_target = expr->targets.back();
      expr->targets.pop_back();
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::Return:
      Consume();
      out_expr->reset(new ReturnExpr(loc));
      break;

    case TokenType::Call:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<CallExpr>(loc, out_expr));
      break;

    case TokenType::CallIndirect: {
      Consume();
      auto expr = MakeUnique<CallIndirectExpr>(loc);
      ParseVarOpt(&expr->table, Var(0, loc));
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::ReturnCall:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ReturnCallExpr>(loc, out_expr));
      break;

    case TokenType::ReturnCallIndirect: {
      ErrorUnlessOpcodeEnabled(Consume());
      auto expr = MakeUnique<ReturnCallIndirectExpr>(loc);
      CHECK_RESULT(ParseTypeUseOpt(&expr->decl));
      CHECK_RESULT(ParseUnboundFuncSignature(&expr->decl.sig));
      ParseVarOpt(&expr->table, Var(0, loc));
      *out_expr = std::move(expr);
      break;
    }

    case TokenType::LocalGet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalGetExpr>(loc, out_expr));
      break;

    case TokenType::LocalSet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalSetExpr>(loc, out_expr));
      break;

    case TokenType::LocalTee:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<LocalTeeExpr>(loc, out_expr));
      break;

    case TokenType::GlobalGet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GlobalGetExpr>(loc, out_expr));
      break;

    case TokenType::GlobalSet:
      Consume();
      CHECK_RESULT(ParsePlainInstrVar<GlobalSetExpr>(loc, out_expr));
      break;

    case TokenType::Load:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<LoadExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Store:
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<StoreExpr>(loc, Consume(), out_expr));
      break;

    case TokenType::Const: {
      Const const_;
      CHECK_RESULT(ParseConst(&const_, ConstType::Normal));
      out_expr->reset(new ConstExpr(const_, loc));
      break;
    }

    case TokenType::Unary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new UnaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Binary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new BinaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::Compare:
      out_expr->reset(new CompareExpr(Consume().opcode(), loc));
      break;

    case TokenType::Convert: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new ConvertExpr(token.opcode(), loc));
      break;
    }

    case TokenType::MemoryCopy:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryCopyExpr(loc));
      break;

    case TokenType::MemoryFill:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new MemoryFillExpr(loc));
      break;

    case TokenType::DataDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<DataDropExpr>(loc, out_expr));
      break;

    case TokenType::MemoryInit:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<MemoryInitExpr>(loc, out_expr));
      break;

    case TokenType::MemorySize:
      Consume();
      out_expr->reset(new MemorySizeExpr(loc));
      break;

    case TokenType::MemoryGrow:
      Consume();
      out_expr->reset(new MemoryGrowExpr(loc));
      break;

    case TokenType::TableCopy: {
      ErrorUnlessOpcodeEnabled(Consume());
      Var dst(0, loc);
      Var src(0, loc);
      if (options_->features.reference_types_enabled()) {
        ParseVarOpt(&dst, dst);
        ParseVarOpt(&src, src);
      }
      out_expr->reset(new TableCopyExpr(dst, src, loc));
      break;
    }

    case TokenType::ElemDrop:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ElemDropExpr>(loc, out_expr));
      break;

    case TokenType::TableInit: {
      ErrorUnlessOpcodeEnabled(Consume());
      Var segment_index(0, loc);
      CHECK_RESULT(ParseVar(&segment_index));
      Var table_index(0, loc);
      if (ParseVarOpt(&table_index, table_index)) {
        // Here are the two forms:
        //
        //   table.init $elemidx ...
        //   table.init $tableidx $elemidx ...
        //
        // So if both indexes are provided, we need to swap them.
        std::swap(segment_index, table_index);
      }
      out_expr->reset(new TableInitExpr(segment_index, table_index, loc));
      break;
    }

    case TokenType::TableGet:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<TableGetExpr>(loc, out_expr));
      break;

    case TokenType::TableSet:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableSetExpr>(loc, out_expr));
      break;

    case TokenType::TableGrow:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableGrowExpr>(loc, out_expr));
      break;

    case TokenType::TableSize:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableSizeExpr>(loc, out_expr));
      break;

    case TokenType::TableFill:
      ErrorUnlessOpcodeEnabled(Consume());
      // TODO: Table index.
      CHECK_RESULT(ParsePlainInstrVar<TableFillExpr>(loc, out_expr));
      break;

    case TokenType::RefFunc:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<RefFuncExpr>(loc, out_expr));
      break;

    case TokenType::RefNull:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RefNullExpr(loc));
      break;

    case TokenType::RefIsNull:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RefIsNullExpr(loc));
      break;

    case TokenType::Throw:
      ErrorUnlessOpcodeEnabled(Consume());
      CHECK_RESULT(ParsePlainInstrVar<ThrowExpr>(loc, out_expr));
      break;

    case TokenType::Rethrow:
      ErrorUnlessOpcodeEnabled(Consume());
      out_expr->reset(new RethrowExpr(loc));
      break;

    case TokenType::AtomicNotify: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicNotifyExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicWait: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicWaitExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicLoad: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicLoadExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicStore: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicStoreExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmw: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::AtomicRmwCmpxchg: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      CHECK_RESULT(
          ParsePlainLoadStoreInstr<AtomicRmwCmpxchgExpr>(loc, token, out_expr));
      break;
    }

    case TokenType::Ternary: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      out_expr->reset(new TernaryExpr(token.opcode(), loc));
      break;
    }

    case TokenType::SimdLaneOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      if (!PeekMatch(TokenType::Nat) && !PeekMatch(TokenType::Int)) {
        return ErrorExpected({"a natural number"}, "123");
      }

      Literal literal = Consume().literal();
      uint64_t lane_idx;

      // TODO: The simd tests currently allow a lane number with an optional +,
      // but probably shouldn't. See
      // https://github.com/WebAssembly/simd/issues/181#issuecomment-597386919
      Result result = ParseInt64(literal.text.begin(), literal.text.end(),
                                 &lane_idx, ParseIntType::SignedAndUnsigned);

      if (Failed(result)) {
        Error(loc, "invalid literal \"" PRIstringview "\"",
              WABT_PRINTF_STRING_VIEW_ARG(literal.text));
        return Result::Error;
      }

      // TODO: Should share lane validation logic w/ SimdShuffleOp below. (See
      // comment below for explanation of 255 vs. 32)
      if (lane_idx > 255) {
        Error(loc, "lane index \"" PRIstringview "\" out-of-range [0, 32)",
              WABT_PRINTF_STRING_VIEW_ARG(literal.text));
        return Result::Error;
      }
      out_expr->reset(new SimdLaneOpExpr(token.opcode(), lane_idx, loc));
      break;
    }

    case TokenType::SimdShuffleOp: {
      Token token = Consume();
      ErrorUnlessOpcodeEnabled(token);
      uint8_t values[16];
      for (int lane = 0; lane < 16; ++lane) {
        Location loc = GetLocation();

        if (!PeekMatch(TokenType::Nat)) {
          return ErrorExpected({"a natural number in range [0, 32)"});
        }

        Literal literal = Consume().literal();

        string_view sv = literal.text;
        const char* s = sv.begin();
        const char* end = sv.end();
        Result result;

        uint32_t value = 0;
        result = ParseInt32(s, end, &value, ParseIntType::UnsignedOnly);

        if (Failed(result)) {
          Error(loc, "invalid literal \"" PRIstringview "\"",
                WABT_PRINTF_STRING_VIEW_ARG(literal.text));
          return Result::Error;
        }

        // The valid range is only [0, 32), but it's only malformed if it can't
        // fit in a byte.
        if (value > 255) {
          Error(loc,
                "shuffle index \"" PRIstringview "\" out-of-range [0, 32)",
                WABT_PRINTF_STRING_VIEW_ARG(literal.text));
          return Result::Error;
        }

        values[lane] = static_cast<uint8_t>(value);
      }
      v128 value = Bitcast<v128>(values);

      out_expr->reset(
          new SimdShuffleOpExpr(token.opcode(), value, loc));
      break;
    }

    default:
      assert(
          !"ParsePlainInstr should only be called when IsPlainInstr() is true");
      return Result::Error;
  }

  return Result::Ok;
}